

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O2

size_t __thiscall
axl::enc::CharCodec::decode_utf8
          (CharCodec *this,String_utf8 *string,void *p0,size_t size,utf32_t replacement)

{
  size_t sVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  DecoderState state;
  utf8_t tmpBuffer [256];
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(string);
  state = 0;
  pvVar2 = (void *)(size + (long)p0);
  for (; p0 < pvVar2; p0 = (void *)((long)p0 + auVar3._8_8_)) {
    auVar3 = (**(code **)(*(long *)this + 0x88))
                       (this,&state,tmpBuffer,0x100,p0,(long)pvVar2 - (long)p0,replacement);
    if (auVar3._8_8_ == 0) break;
    sVar1 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append
                      (string,tmpBuffer,auVar3._0_8_);
    if (sVar1 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
  }
  return (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
}

Assistant:

size_t
CharCodec::decode_utf8(
	sl::String_utf8* string,
	const void* p0,
	size_t size,
	utf32_t replacement
) {
	string->clear();

	DecoderState state = 0;
	const char* p = (const char*)p0;
	const char* end = p + size;
	while (p < end) {
		utf8_t tmpBuffer[256];
		ConvertLengthResult result = decode_utf8(
			&state,
			tmpBuffer,
			countof(tmpBuffer),
			p,
			end - p,
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t length = string->append(tmpBuffer, result.m_dstLength);
		if (length == -1)
			return -1;

		p += result.m_srcLength;
	}

	return string->getLength();
}